

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool SetProxy(Network net,Proxy *addrProxy)

{
  bool bVar1;
  undefined8 in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock5;
  GlobalMutex *in_stack_ffffffffffffffb8;
  Proxy *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe4;
  byte bVar3;
  char *in_stack_ffffffffffffffe8;
  GlobalMutex *in_stack_fffffffffffffff0;
  UniqueLock<GlobalMutex> *this;
  
  this = *(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28);
  uVar2 = in_EDI < 7;
  if (!(bool)uVar2) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2a9,"bool SetProxy(enum Network, const Proxy &)");
  }
  bVar1 = Proxy::IsValid(in_stack_ffffffffffffffc0);
  if (bVar1) {
    MaybeCheckNotHeld<GlobalMutex>(in_stack_ffffffffffffffb8);
    UniqueLock<GlobalMutex>::UniqueLock
              (this,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
               (char *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI),(int)((ulong)in_RSI >> 0x20),
               SUB81((ulong)in_RSI >> 0x18,0));
    Proxy::operator=((Proxy *)CONCAT44(in_stack_ffffffffffffffcc,
                                       CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffca,
                                                               in_stack_ffffffffffffffc8))),
                     in_stack_ffffffffffffffc0);
    bVar3 = 1;
    UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffffb8);
  }
  else {
    bVar3 = 0;
  }
  if (*(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28) == this) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SetProxy(enum Network net, const Proxy &addrProxy) {
    assert(net >= 0 && net < NET_MAX);
    if (!addrProxy.IsValid())
        return false;
    LOCK(g_proxyinfo_mutex);
    proxyInfo[net] = addrProxy;
    return true;
}